

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

LR des_IP(LR lr)

{
  uint32_t uVar1;
  LR local_18;
  LR lr_local;
  
  local_18 = lr;
  des_bitswap_IP_FP(&local_18.R,&local_18.L,4,0xf0f0f0f);
  des_bitswap_IP_FP(&local_18.R,&local_18.L,0x10,0xffff);
  des_bitswap_IP_FP(&local_18.L,&local_18.R,2,0x33333333);
  des_bitswap_IP_FP(&local_18.L,&local_18.R,8,0xff00ff);
  des_bitswap_IP_FP(&local_18.R,&local_18.L,1,0x55555555);
  uVar1 = ror(local_18.L,1);
  local_18.L = uVar1;
  uVar1 = ror(local_18.R,1);
  local_18.R = uVar1;
  return local_18;
}

Assistant:

static inline LR des_IP(LR lr)
{
    des_bitswap_IP_FP(&lr.R, &lr.L,  4, 0x0F0F0F0F);
    des_bitswap_IP_FP(&lr.R, &lr.L, 16, 0x0000FFFF);
    des_bitswap_IP_FP(&lr.L, &lr.R,  2, 0x33333333);
    des_bitswap_IP_FP(&lr.L, &lr.R,  8, 0x00FF00FF);
    des_bitswap_IP_FP(&lr.R, &lr.L,  1, 0x55555555);

    lr.L = ror(lr.L, 1);
    lr.R = ror(lr.R, 1);

    return lr;
}